

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graphics.cpp
# Opt level: O0

void __thiscall nite::Batch::unload(Batch *this)

{
  size_type sVar1;
  reference pvVar2;
  reference ppBVar3;
  reference pvVar4;
  ulong uVar5;
  __normal_iterator<nite::Batch_**,_std::vector<nite::Batch_*,_std::allocator<nite::Batch_*>_>_>
  local_30;
  __normal_iterator<nite::Batch_**,_std::vector<nite::Batch_*,_std::allocator<nite::Batch_*>_>_>
  local_28;
  const_iterator local_20;
  uint local_14;
  Batch *pBStack_10;
  uint i;
  Batch *this_local;
  
  pBStack_10 = this;
  clearBuffer(this);
  if ((-1 < this->objectId) &&
     (sVar1 = std::vector<BatchT,_std::allocator<BatchT>_>::size(&batches), sVar1 != 0)) {
    local_14 = 0;
    while( true ) {
      uVar5 = (ulong)local_14;
      pvVar2 = std::vector<BatchT,_std::allocator<BatchT>_>::operator[]
                         (&batches,(long)this->objectId);
      sVar1 = std::vector<nite::Batch_*,_std::allocator<nite::Batch_*>_>::size(&pvVar2->owners);
      if (sVar1 <= uVar5) break;
      pvVar2 = std::vector<BatchT,_std::allocator<BatchT>_>::operator[]
                         (&batches,(long)this->objectId);
      ppBVar3 = std::vector<nite::Batch_*,_std::allocator<nite::Batch_*>_>::operator[]
                          (&pvVar2->owners,(ulong)local_14);
      if (*ppBVar3 == this) {
        pvVar2 = std::vector<BatchT,_std::allocator<BatchT>_>::operator[]
                           (&batches,(long)this->objectId);
        pvVar4 = std::vector<BatchT,_std::allocator<BatchT>_>::operator[]
                           (&batches,(long)this->objectId);
        local_30._M_current =
             (Batch **)
             std::vector<nite::Batch_*,_std::allocator<nite::Batch_*>_>::begin(&pvVar4->owners);
        local_28 = __gnu_cxx::
                   __normal_iterator<nite::Batch_**,_std::vector<nite::Batch_*,_std::allocator<nite::Batch_*>_>_>
                   ::operator+(&local_30,(ulong)local_14);
        __gnu_cxx::
        __normal_iterator<nite::Batch*const*,std::vector<nite::Batch*,std::allocator<nite::Batch*>>>
        ::__normal_iterator<nite::Batch**>
                  ((__normal_iterator<nite::Batch*const*,std::vector<nite::Batch*,std::allocator<nite::Batch*>>>
                    *)&local_20,&local_28);
        std::vector<nite::Batch_*,_std::allocator<nite::Batch_*>_>::erase(&pvVar2->owners,local_20);
        break;
      }
      local_14 = local_14 + 1;
    }
    pvVar2 = std::vector<BatchT,_std::allocator<BatchT>_>::operator[](&batches,(long)this->objectId)
    ;
    sVar1 = std::vector<nite::Batch_*,_std::allocator<nite::Batch_*>_>::size(&pvVar2->owners);
    if (sVar1 == 0) {
      pvVar2 = std::vector<BatchT,_std::allocator<BatchT>_>::operator[]
                         (&batches,(long)this->objectId);
      BatchT::clear(pvVar2);
    }
    this->objectId = -1;
  }
  return;
}

Assistant:

void nite::Batch::unload(){	
	clearBuffer();	
	if (objectId <= -1 || batches.size() == 0) return;
	for(unsigned i=0; i<batches[objectId].owners.size(); i++){
		if (batches[objectId].owners[i] == this){
			batches[objectId].owners.erase(batches[objectId].owners.begin()+i);
			break;
		}
	}
	if (batches[objectId].owners.size() == 0){
		batches[objectId].clear();
	}
  	objectId = -1;	
}